

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_do(connectdata *conn,_Bool *done)

{
  curl_mimepart *part;
  uint *puVar1;
  Curl_easy *pCVar2;
  void *pvVar3;
  undefined4 *puVar4;
  bool bVar5;
  connectdata *conn_00;
  _Bool _Var6;
  byte bVar7;
  CURLcode CVar8;
  int iVar9;
  curl_off_t cVar10;
  char *pcVar11;
  size_t sVar12;
  char *pcVar13;
  CURLcode unaff_EBP;
  byte connected;
  _Bool *p_Var14;
  Curl_easy *data;
  long lVar15;
  char *pcVar16;
  char *value;
  char *name;
  char *local_58;
  char *local_50;
  size_t local_48;
  _Bool *local_40;
  connectdata *local_38;
  
  *done = false;
  pCVar2 = conn->data;
  pvVar3 = (pCVar2->req).protop;
  pcVar16 = (pCVar2->state).up.path;
  lVar15 = 1;
  pcVar13 = pcVar16;
  local_40 = done;
  local_38 = conn;
  do {
    pcVar11 = pcVar13;
    pcVar13 = pcVar11 + 1;
    _Var6 = imap_is_bchar(pcVar11[1]);
    lVar15 = lVar15 + -1;
  } while (_Var6);
  if (lVar15 == 0) {
    *(undefined8 *)((long)pvVar3 + 8) = 0;
LAB_00132970:
    while (*pcVar13 == ';') {
      pcVar16 = pcVar13 + 1;
      sVar12 = 0;
      pcVar13 = pcVar16;
LAB_00132981:
      if (*pcVar13 == '\0') goto LAB_00132ace;
      if (*pcVar13 != '=') goto code_r0x00132992;
      bVar5 = false;
      CVar8 = Curl_urldecode(pCVar2,pcVar16,sVar12,&local_50,(size_t *)0x0,true);
      if (CVar8 != CURLE_OK) goto LAB_00132ad6;
      pcVar16 = pcVar13 + 1;
      sVar12 = 0xffffffffffffffff;
      do {
        pcVar11 = pcVar13 + 1;
        pcVar13 = pcVar13 + 1;
        _Var6 = imap_is_bchar(*pcVar11);
        sVar12 = sVar12 + 1;
      } while (_Var6);
      CVar8 = Curl_urldecode(pCVar2,pcVar16,sVar12,&local_58,&local_48,true);
      if (CVar8 == CURLE_OK) {
        iVar9 = Curl_strcasecompare(local_50,"UIDVALIDITY");
        if ((iVar9 == 0) || (*(long *)((long)pvVar3 + 0x10) != 0)) {
          iVar9 = Curl_strcasecompare(local_50,"UID");
          if ((iVar9 == 0) || (*(long *)((long)pvVar3 + 0x18) != 0)) {
            iVar9 = Curl_strcasecompare(local_50,"MAILINDEX");
            if ((iVar9 == 0) || (*(long *)((long)pvVar3 + 0x20) != 0)) {
              iVar9 = Curl_strcasecompare(local_50,"SECTION");
              if ((iVar9 == 0) || (*(long *)((long)pvVar3 + 0x28) != 0)) {
                iVar9 = Curl_strcasecompare(local_50,"PARTIAL");
                if ((iVar9 == 0) || (*(long *)((long)pvVar3 + 0x30) != 0)) {
                  (*Curl_cfree)(local_50);
                  (*Curl_cfree)(local_58);
LAB_00132ace:
                  bVar5 = false;
                  CVar8 = CURLE_URL_MALFORMAT;
                  goto LAB_00132ad6;
                }
                if ((local_48 != 0) && (local_58[local_48 - 1] == '/')) {
                  local_58[local_48 - 1] = '\0';
                }
                *(char **)((long)pvVar3 + 0x30) = local_58;
              }
              else {
                if ((local_48 != 0) && (local_58[local_48 - 1] == '/')) {
                  local_58[local_48 - 1] = '\0';
                }
                *(char **)((long)pvVar3 + 0x28) = local_58;
              }
            }
            else {
              if ((local_48 != 0) && (local_58[local_48 - 1] == '/')) {
                local_58[local_48 - 1] = '\0';
              }
              *(char **)((long)pvVar3 + 0x20) = local_58;
            }
          }
          else {
            if ((local_48 != 0) && (local_58[local_48 - 1] == '/')) {
              local_58[local_48 - 1] = '\0';
            }
            *(char **)((long)pvVar3 + 0x18) = local_58;
          }
        }
        else {
          if ((local_48 != 0) && (local_58[local_48 - 1] == '/')) {
            local_58[local_48 - 1] = '\0';
          }
          *(char **)((long)pvVar3 + 0x10) = local_58;
        }
        local_58 = (char *)0x0;
        (*Curl_cfree)(local_50);
        (*Curl_cfree)(local_58);
        bVar5 = true;
        CVar8 = unaff_EBP;
      }
      else {
        (*Curl_cfree)(local_50);
        bVar5 = false;
      }
LAB_00132ad6:
      unaff_EBP = CVar8;
      if (!bVar5) goto LAB_00132bfe;
    }
    if (((*(long *)((long)pvVar3 + 8) != 0) && (*(long *)((long)pvVar3 + 0x18) == 0)) &&
       (*(long *)((long)pvVar3 + 0x20) == 0)) {
      curl_url_get((pCVar2->state).uh,CURLUPART_QUERY,(char **)((long)pvVar3 + 0x38),0x40);
    }
    unaff_EBP = (uint)(*pcVar13 != '\0') * 3;
  }
  else {
    pcVar16 = pcVar16 + 1;
    if (*pcVar11 != '/') {
      pcVar11 = pcVar13;
    }
    unaff_EBP = Curl_urldecode(pCVar2,pcVar16,(long)pcVar11 - (long)pcVar16,
                               (char **)((long)pvVar3 + 8),(size_t *)0x0,true);
    if (unaff_EBP == CURLE_OK) goto LAB_00132970;
  }
LAB_00132bfe:
  conn_00 = local_38;
  if (unaff_EBP != CURLE_OK) {
    return unaff_EBP;
  }
  pCVar2 = local_38->data;
  pcVar16 = (pCVar2->set).str[6];
  if (pcVar16 == (char *)0x0) {
LAB_00132c5d:
    CVar8 = CURLE_OK;
  }
  else {
    pvVar3 = (pCVar2->req).protop;
    CVar8 = Curl_urldecode(pCVar2,pcVar16,0,(char **)((long)pvVar3 + 0x40),(size_t *)0x0,true);
    if (CVar8 == CURLE_OK) {
      pcVar16 = *(char **)((long)pvVar3 + 0x40);
      for (pcVar13 = pcVar16; *pcVar13 != '\0'; pcVar13 = pcVar13 + 1) {
        if (*pcVar13 == ' ') {
          pcVar13 = (*Curl_cstrdup)(pcVar13);
          *(char **)((long)pvVar3 + 0x48) = pcVar13;
          *pcVar16 = '\0';
          CVar8 = CURLE_OUT_OF_MEMORY;
          if (*(long *)((long)pvVar3 + 0x48) != 0) {
            CVar8 = CURLE_OK;
          }
          goto LAB_00132c5f;
        }
        pcVar16 = pcVar16 + 1;
      }
      goto LAB_00132c5d;
    }
  }
LAB_00132c5f:
  if (CVar8 != CURLE_OK) {
    return CVar8;
  }
  pCVar2 = conn_00->data;
  (pCVar2->req).size = -1;
  Curl_pgrsSetUploadCounter(pCVar2,0);
  Curl_pgrsSetDownloadCounter(pCVar2,0);
  Curl_pgrsSetUploadSize(pCVar2,-1);
  pcVar16 = (char *)0xffffffffffffffff;
  Curl_pgrsSetDownloadSize(pCVar2,-1);
  pCVar2 = conn_00->data;
  puVar4 = (undefined4 *)(pCVar2->req).protop;
  if ((pCVar2->set).opt_no_body == true) {
    *puVar4 = 1;
  }
  *local_40 = false;
  if ((((*(char **)(puVar4 + 2) == (char *)0x0) ||
       (pcVar16 = (conn_00->proto).imapc.mailbox, pcVar16 == (char *)0x0)) ||
      (iVar9 = Curl_strcasecompare(*(char **)(puVar4 + 2),pcVar16), iVar9 == 0)) ||
     (((*(char **)(puVar4 + 4) != (char *)0x0 &&
       (pcVar16 = (conn_00->proto).imapc.mailbox_uidvalidity, pcVar16 != (char *)0x0)) &&
      (iVar9 = Curl_strcasecompare(*(char **)(puVar4 + 4),pcVar16), iVar9 == 0)))) {
    connected = (byte)pcVar16;
    bVar7 = 0;
  }
  else {
    connected = (byte)pcVar16;
    bVar7 = 1;
  }
  data = conn_00->data;
  if (((data->set).upload == false) && ((pCVar2->set).mimepost.kind == MIMEKIND_NONE)) {
    lVar15 = *(long *)(puVar4 + 0x10);
    if ((lVar15 == 0) || ((bVar7 == 0 && (*(long *)(puVar4 + 2) != 0)))) {
      connected = bVar7 ^ 1 | lVar15 != 0;
      if (connected == 0) {
        if ((*(long *)(puVar4 + 6) != 0) || (*(long *)(puVar4 + 8) != 0)) {
          CVar8 = imap_perform_fetch(conn_00);
          goto LAB_00132fad;
        }
        if (*(long *)(puVar4 + 0xe) != 0) {
          CVar8 = imap_perform_search(conn_00);
          goto LAB_00132fad;
        }
      }
      if ((bVar7 == 0 && *(long *)(puVar4 + 2) != 0) &&
         ((((lVar15 != 0 || (*(long *)(puVar4 + 6) != 0)) || (*(long *)(puVar4 + 8) != 0)) ||
          (*(long *)(puVar4 + 0xe) != 0)))) {
        pvVar3 = (data->req).protop;
        (*Curl_cfree)((conn_00->proto).imapc.mailbox);
        (conn_00->proto).imapc.mailbox = (char *)0x0;
        (*Curl_cfree)((conn_00->proto).imapc.mailbox_uidvalidity);
        (conn_00->proto).imapc.mailbox_uidvalidity = (char *)0x0;
        pcVar16 = *(char **)((long)pvVar3 + 8);
        if (pcVar16 == (char *)0x0) {
          data = conn_00->data;
          pcVar16 = "Cannot SELECT without a mailbox.";
          goto LAB_00132e7c;
        }
        connected = 0;
        pcVar16 = imap_atom(pcVar16,false);
        if (pcVar16 != (char *)0x0) {
          connected = 5;
          CVar8 = imap_sendf(conn_00,"SELECT %s",pcVar16);
          (*Curl_cfree)(pcVar16);
          if (CVar8 == CURLE_OK) {
            (conn_00->proto).imapc.state = IMAP_SELECT;
          }
          goto LAB_00132fad;
        }
        goto LAB_00132fa8;
      }
    }
    CVar8 = imap_perform_list(conn_00);
  }
  else {
    pvVar3 = (data->req).protop;
    if (*(long *)((long)pvVar3 + 8) == 0) {
      pcVar16 = "Cannot APPEND without a mailbox.";
LAB_00132e7c:
      Curl_failf(data,pcVar16);
      connected = (byte)pcVar16;
      CVar8 = CURLE_URL_MALFORMAT;
      goto LAB_00132fad;
    }
    if ((data->set).mimepost.kind != MIMEKIND_NONE) {
      part = &(data->set).mimepost;
      puVar1 = &(data->set).mimepost.flags;
      *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
      curl_mime_headers(part,(data->set).headers,0);
      connected = 0;
      CVar8 = Curl_mime_prepare_headers(part,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
      if (CVar8 == CURLE_OK) {
        connected = 0x81;
        pcVar16 = Curl_checkheaders(conn_00,"Mime-Version");
        CVar8 = CURLE_OK;
        if (pcVar16 == (char *)0x0) {
          connected = 0x8e;
          CVar8 = Curl_mime_add_header(&(data->set).mimepost.curlheaders,"Mime-Version: 1.0");
        }
      }
      if (CVar8 == CURLE_OK) {
        CVar8 = Curl_mime_rewind(part);
      }
      if (CVar8 != CURLE_OK) goto LAB_00132fad;
      cVar10 = Curl_mime_size(part);
      (data->state).infilesize = cVar10;
      (data->state).fread_func = Curl_mime_read;
      (data->state).in = part;
    }
    if ((data->state).infilesize < 0) {
      connected = 0xa0;
      Curl_failf(data,"Cannot APPEND with unknown input file size\n");
      CVar8 = CURLE_UPLOAD_FAILED;
      goto LAB_00132fad;
    }
    connected = 0;
    pcVar16 = imap_atom(*(char **)((long)pvVar3 + 8),false);
    if (pcVar16 != (char *)0x0) {
      connected = 0xcc;
      CVar8 = imap_sendf(conn_00,"APPEND %s (\\Seen) {%ld}",pcVar16,(data->state).infilesize);
      (*Curl_cfree)(pcVar16);
      if (CVar8 == CURLE_OK) {
        (conn_00->proto).imapc.state = IMAP_APPEND;
      }
      goto LAB_00132fad;
    }
LAB_00132fa8:
    CVar8 = CURLE_OUT_OF_MEMORY;
  }
LAB_00132fad:
  if (CVar8 == CURLE_OK) {
    p_Var14 = local_40;
    CVar8 = imap_multi_statemach(conn_00,local_40);
    connected = (byte)p_Var14;
  }
  if ((CVar8 == CURLE_OK) && (CVar8 = CURLE_OK, *local_40 == true)) {
    imap_dophase_done(conn_00,(_Bool)connected);
  }
  return CVar8;
code_r0x00132992:
  pcVar13 = pcVar13 + 1;
  sVar12 = sVar12 + 1;
  goto LAB_00132981;
}

Assistant:

static CURLcode imap_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = imap_parse_url_path(conn);
  if(result)
    return result;

  /* Parse the custom request */
  result = imap_parse_custom_request(conn);
  if(result)
    return result;

  result = imap_regular_transfer(conn, done);

  return result;
}